

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O2

void __thiscall Network::add_link(Network *this,uint node_i,uint node_j)

{
  size_type sVar1;
  uint node_j_local;
  uint node_i_local;
  
  _node_j_local = CONCAT44(node_i,node_j);
  sVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    ((this->links).
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + node_i,&node_j_local);
  if (sVar1 == 0) {
    update_triangles(this,node_i,node_j_local,true);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)((this->links).
                   super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + node_i),&node_j_local);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)((this->links).
                   super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (_node_j_local & 0xffffffff)),
               &node_i_local);
    return;
  }
  __assert_fail("links[node_i].count(node_j) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                ,0xb0,"void Network::add_link(unsigned int, unsigned int)");
}

Assistant:

void add_link(unsigned int node_i, unsigned int node_j) {
        assert(links[node_i].count(node_j) == 0);  // link must not exist

        update_triangles(node_i, node_j, true);

        links[node_i].insert(node_j);
        links[node_j].insert(node_i);
    }